

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

AddPropertyCacheBucket * __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::FindOrInsertNew
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,int value)

{
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  Bucket<AddPropertyCacheBucket> *newBucket;
  Bucket<AddPropertyCacheBucket> *bucket;
  EditingIterator iter;
  uint depth;
  uint hash;
  int value_local;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this_local;
  
  uVar2 = Hash(this,value);
  iter.last._4_4_ = 1;
  SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&bucket,this->table + uVar2);
  do {
    bVar1 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)&bucket);
    if (!bVar1) {
LAB_004f1171:
      pTVar3 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
               EditingIterator::InsertNodeBefore((EditingIterator *)&bucket,this->alloc);
      pTVar3->value = value;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Insert(this->stats,iter.last._4_4_);
      }
      return &pTVar3->element;
    }
    pTVar3 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
             ::Data((Iterator *)&bucket);
    if (pTVar3->value <= value) {
      if (pTVar3->value == value) {
        return &pTVar3->element;
      }
      goto LAB_004f1171;
    }
    iter.last._4_4_ = iter.last._4_4_ + 1;
  } while( true );
}

Assistant:

T * FindOrInsertNew(int value)
    {
        uint hash = this->Hash(value);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[hash], iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
        newBucket->value = value;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return &newBucket->element;
    }